

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmEnumPathSegmentsGenerator&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmEnumPathSegmentsGenerator *gen,cmAppendPathSegmentGenerator *tail,
               cmProjectDirectoryListGenerator *tail_1)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  string path_1;
  string path;
  string local_a8;
  undefined1 local_88 [32];
  string *local_68;
  cmEnumPathSegmentsGenerator *local_60;
  anon_class_8_1_8991fb9c *local_58;
  string local_50;
  
  (gen->Current)._M_current =
       (((gen->Names)._M_data)->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_68 = startPath;
  local_60 = gen;
  local_58 = filesCollector;
  anon_unknown.dwarf_50b80c::cmEnumPathSegmentsGenerator::GetNextCandidate
            ((string *)local_88,gen,(string *)(startPath->_M_dataplus)._M_p);
  if (local_88._8_8_ == 0) {
    bVar1 = false;
  }
  else {
    this = &(tail_1->super_cmDirectoryListGenerator).Matches;
    do {
      tail->NeedReset = false;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this,(tail_1->super_cmDirectoryListGenerator).Matches.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      (tail_1->super_cmDirectoryListGenerator).Current._M_current =
           (tail_1->super_cmDirectoryListGenerator).Matches.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      tail->NeedReset = false;
      anon_unknown.dwarf_50b80c::cmAppendPathSegmentGenerator::GetNextCandidate
                (&local_a8,tail,(string *)local_88._0_8_);
      if (local_a8._M_string_length == 0) {
        bVar1 = false;
      }
      else {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(this,(tail_1->super_cmDirectoryListGenerator).Matches.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
          (tail_1->super_cmDirectoryListGenerator).Current._M_current =
               (tail_1->super_cmDirectoryListGenerator).Matches.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          bVar1 = TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
                            (local_58,&local_a8,tail_1);
          if (bVar1) break;
          anon_unknown.dwarf_50b80c::cmAppendPathSegmentGenerator::GetNextCandidate
                    (&local_50,tail,(string *)local_88._0_8_);
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        } while (local_a8._M_string_length != 0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (bVar1 != false) break;
      anon_unknown.dwarf_50b80c::cmEnumPathSegmentsGenerator::GetNextCandidate
                (&local_a8,local_60,(string *)(local_68->_M_dataplus)._M_p);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    } while (local_88._8_8_ != 0);
  }
  if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  return bVar1;
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}